

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void * seq_writer_thread(void *args)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  person_t p;
  
  for (iVar3 = 0; iVar3 != 10; iVar3 = iVar3 + 1) {
    uVar2 = 0;
    while (iVar1 = (int)uVar2, iVar1 != 10000) {
      gen_person(&p);
      p.age = iVar1;
      sprintf(p.key,"person%d",uVar2);
      e2e_fdb_set_person((storage_t *)args,&p);
      uVar2 = (ulong)(iVar1 + 1);
    }
    e2e_fdb_commit(*args,true);
  }
  return (void *)0x0;
}

Assistant:

void *seq_writer_thread(void *args) {

    int j, i = 0, n=10000;
    person_t p;
    storage_t *st = (storage_t *)args;
    for (j = 0; j < 10; ++j) {
        for (i = 0; i < n; ++i) {
            gen_person(&p);
            p.age = i;
            sprintf(p.key, "person%d", i);
            e2e_fdb_set_person(st, &p);
        }
        e2e_fdb_commit(st->main, true);
    }
    return NULL;
}